

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O1

uint __thiscall
QFragmentMapData<QTextFragmentData>::findNode
          (QFragmentMapData<QTextFragmentData> *this,int k,uint field)

{
  Header *pHVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  bool bVar5;
  
  pHVar1 = (this->field_0).head;
  uVar2 = pHVar1->root;
  if (uVar2 != 0) {
    do {
      lVar3 = (ulong)uVar2 * 0x20;
      uVar4 = *(uint *)((long)pHVar1 + ((ulong)field + 4) * 4 + lVar3);
      if ((uint)k < uVar4) {
        lVar3 = lVar3 + 4;
      }
      else {
        uVar4 = uVar4 + *(int *)((long)pHVar1 + ((ulong)field + 5) * 4 + lVar3);
        bVar5 = (uint)k < uVar4;
        k = k - uVar4;
        if (bVar5) {
          return uVar2;
        }
        lVar3 = lVar3 + 8;
      }
      uVar2 = *(uint *)((long)&pHVar1->root + lVar3);
    } while (uVar2 != 0);
  }
  return 0;
}

Assistant:

inline uint root() const {
        Q_ASSERT(!head->root || !fragment(head->root)->parent);
        return head->root;
    }